

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<JointPolicyPureVectorForClusteredBG> * __thiscall
boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator=
          (shared_ptr<JointPolicyPureVectorForClusteredBG> *this,
          shared_ptr<JointPolicyPureVectorForClusteredBG> *r)

{
  shared_ptr<JointPolicyPureVectorForClusteredBG> *in_RDI;
  shared_ptr<JointPolicyPureVectorForClusteredBG> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96f23e);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }